

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_blocksize.c
# Opt level: O0

unsigned_long parse_blocksize(char *bs)

{
  char cVar1;
  ulong uVar2;
  ushort **ppuVar3;
  bool bVar4;
  unsigned_long local_20;
  unsigned_long r;
  char *suf;
  char *bs_local;
  
  suf = bs;
  uVar2 = strtoul(bs,(char **)&r,10);
  if (*(char *)r == '\0') {
    return uVar2;
  }
  while( true ) {
    bVar4 = false;
    if (*(char *)r != '\0') {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)(uint)*(byte *)r] & 0x2000) != 0;
    }
    if (!bVar4) break;
    r = r + 1;
  }
  cVar1 = *(char *)r;
  if (cVar1 == '\0') {
    return uVar2;
  }
  if (cVar1 == 'G') {
LAB_001b6b48:
    local_20 = uVar2 << 0x1e;
  }
  else {
    if (cVar1 == 'K') {
LAB_001b6b2c:
      return uVar2 << 10;
    }
    if (cVar1 != 'M') {
      if (cVar1 == 'g') goto LAB_001b6b48;
      if (cVar1 == 'k') goto LAB_001b6b2c;
      if (cVar1 != 'm') {
        return uVar2;
      }
    }
    local_20 = uVar2 << 0x14;
  }
  return local_20;
}

Assistant:

unsigned long parse_blocksize(const char *bs)
{
    char *suf;
    unsigned long r = strtoul(bs, &suf, 10);
    if (*suf != '\0') {
        while (*suf && isspace((unsigned char)*suf)) suf++;
        switch (*suf) {
          case 'k': case 'K':
            r *= 1024ul;
            break;
          case 'm': case 'M':
            r *= 1024ul * 1024ul;
            break;
          case 'g': case 'G':
            r *= 1024ul * 1024ul * 1024ul;
            break;
          case '\0':
          default:
            break;
        }
    }
    return r;
}